

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

InterpretResult run(Vm *vm)

{
  CallFrame ***pppCVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  ObjectType OVar5;
  ValueType VVar6;
  uint32_t index;
  CallFrame *pCVar7;
  uint8_t *puVar8;
  CrispyValue *pCVar9;
  ObjList *pOVar10;
  Object *pOVar11;
  object_t *poVar12;
  size_t __n;
  CallFrame **ppCVar13;
  ulong uVar14;
  long lVar15;
  HashTable content;
  undefined4 uVar16;
  _Bool _Var17;
  int iVar18;
  InterpretResult IVar19;
  ValueType VVar20;
  byte bVar24;
  ObjDict *object;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar21;
  ObjString *list;
  CallFrame *pCVar22;
  CrispyValue *pCVar23;
  uint uVar25;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 in_RDX;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_00;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_01;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_02;
  long lVar26;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_05;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_06;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_07;
  long lVar27;
  byte *pbVar28;
  byte *pbVar29;
  CrispyValue *pCVar30;
  bool bVar31;
  double dVar32;
  double dVar33;
  undefined8 uVar34;
  CrispyValue first;
  CrispyValue first_00;
  CrispyValue first_01;
  CrispyValue first_02;
  CrispyValue value_00;
  CrispyValue first_03;
  CrispyValue first_04;
  CrispyValue value_01;
  HTItemKey key;
  HTItemKey key_00;
  CrispyValue value_02;
  HTItemKey key_01;
  CrispyValue value_03;
  undefined1 auVar35 [16];
  CrispyValue CVar36;
  CrispyValue second;
  CrispyValue second_00;
  CrispyValue second_01;
  CrispyValue second_02;
  CrispyValue second_03;
  CrispyValue second_04;
  CrispyValue value_04;
  CrispyValue value_05;
  undefined8 uStack_a8;
  undefined1 auStack_a0 [8];
  CrispyValue value;
  HTItem **ppHStack_88;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_03;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 extraout_RDX_04;
  
  pCVar30 = vm->sp;
  if (-1 < (long)pCVar30 - (long)vm) {
    pppCVar1 = &(vm->frames).frame_pointers;
    pCVar7 = (vm->frames).frame_pointers[vm->frame_count - 1];
    puVar8 = (pCVar7->code_buffer).code;
    pCVar9 = (pCVar7->constants).values;
    pbVar28 = pCVar7->ip;
    do {
      if (0x31 < *pbVar28) {
        printf("Unknown instruction %d\n");
        return INTERPRET_RUNTIME_ERROR;
      }
      pbVar29 = pbVar28 + 1;
      switch(*pbVar28) {
      default:
        _Var17 = false;
        goto LAB_00103ae7;
      case 1:
        _Var17 = true;
LAB_00103ae7:
        CVar36 = create_bool(_Var17);
LAB_00103d8a:
        in_RDX = CVar36.field_1;
        pCVar30->type = CVar36.type;
        (pCVar30->field_1).p_value = (uint64_t)in_RDX;
LAB_00103d95:
        pCVar30 = pCVar30 + 1;
        break;
      case 3:
        CVar36 = create_nil();
        goto LAB_00103d8a;
      case 4:
        VVar20 = pCVar30[-1].type;
        aVar21 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)pCVar30[-1].field_1.o_value;
        pOVar10 = (ObjList *)pCVar30[-2].field_1.o_value;
        in_RDX._0_4_ = VVar20 ^ NUMBER | pCVar30[-2].type ^ NUMBER;
        in_RDX.p_value._4_4_ = 0;
        if (in_RDX._0_4_ == NIL) {
          dVar33 = aVar21.d_value + (double)pOVar10;
          pCVar30[-2].type = NUMBER;
          goto LAB_00103c85;
        }
        if (pCVar30[-2].type != OBJECT) {
          run_cold_20();
          return INTERPRET_RUNTIME_ERROR;
        }
        (pOVar10->object).marked = '\x01';
        OVar5 = (pOVar10->object).type;
        if (OVar5 == OBJ_LIST) {
          list = (ObjString *)clone_list(vm,pOVar10);
          value_03._4_4_ = 0;
          value_03.type = VVar20;
          value_03.field_1.o_value = (Object *)aVar21.p_value;
          list_append((ObjList *)list,value_03);
        }
        else {
          if (OVar5 != OBJ_STRING) {
            run_cold_22();
            return INTERPRET_RUNTIME_ERROR;
          }
          if ((VVar20 != OBJECT) || ((aVar21.o_value)->type != OBJ_STRING)) {
            run_cold_21();
            return INTERPRET_RUNTIME_ERROR;
          }
          (aVar21.o_value)->marked = '\x01';
          list = new_empty_string(vm,*(long *)(aVar21.p_value + 0x10) + (pOVar10->content).cap);
          memcpy(list->start,(void *)(pOVar10->content).count,(pOVar10->content).cap);
          pOVar11 = (Object *)(aVar21.p_value + 0x10);
          __n._0_1_ = pOVar11->marked;
          __n._1_3_ = *(undefined3 *)&pOVar11->field_0x1;
          __n._4_4_ = pOVar11->type;
          memcpy(list->start + (pOVar10->content).cap,*(object_t **)(aVar21.p_value + 0x18),__n);
        }
        CVar36 = create_object(&list->object);
        goto LAB_00103cd8;
      case 5:
        if (pCVar30[-2].type != NUMBER) {
          return INTERPRET_RUNTIME_ERROR;
        }
        if (pCVar30[-1].type != NUMBER) {
          return INTERPRET_RUNTIME_ERROR;
        }
        dVar33 = pCVar30[-2].field_1.d_value - pCVar30[-1].field_1.d_value;
        goto LAB_00103c85;
      case 6:
        if (pCVar30[-2].type != NUMBER) {
          return INTERPRET_RUNTIME_ERROR;
        }
        if (pCVar30[-1].type != NUMBER) {
          return INTERPRET_RUNTIME_ERROR;
        }
        dVar33 = pCVar30[-2].field_1.d_value * pCVar30[-1].field_1.d_value;
LAB_00103c85:
        pCVar30[-2].field_1.d_value = dVar33;
        pCVar30 = pCVar30 + -1;
        break;
      case 7:
        if (pCVar30[-2].type != NUMBER) {
          return INTERPRET_RUNTIME_ERROR;
        }
        if (pCVar30[-1].type != NUMBER) {
          return INTERPRET_RUNTIME_ERROR;
        }
        dVar33 = pCVar30[-1].field_1.d_value;
        if ((dVar33 == 0.0) && (!NAN(dVar33))) {
          run_cold_18();
        }
        pCVar30[-2].type = NUMBER;
        pCVar30[-2].field_1.d_value = pCVar30[-2].field_1.d_value / dVar33;
        pCVar30 = pCVar30 + -1;
        break;
      case 8:
        if ((pCVar30[-2].type != NUMBER) || (pCVar30[-1].type != NUMBER)) {
          run_cold_19();
          return INTERPRET_RUNTIME_ERROR;
        }
        dVar33 = (double)((long)pCVar30[-2].field_1.d_value % (long)pCVar30[-1].field_1.d_value);
        goto LAB_00103d1c;
      case 9:
        if (pCVar30[-2].type != NUMBER) {
          return INTERPRET_RUNTIME_ERROR;
        }
        if (pCVar30[-1].type != NUMBER) {
          return INTERPRET_RUNTIME_ERROR;
        }
        dVar33 = pow(pCVar30[-2].field_1.d_value,pCVar30[-1].field_1.d_value);
LAB_00103d1c:
        CVar36 = create_number(dVar33);
        goto LAB_00103cd8;
      case 10:
        if (pCVar30[-2].type != BOOLEAN) {
          return INTERPRET_RUNTIME_ERROR;
        }
        if (pCVar30[-1].type != BOOLEAN) {
          return INTERPRET_RUNTIME_ERROR;
        }
        bVar31 = pCVar30[-1].field_1.p_value != 0 && pCVar30[-2].field_1.p_value != 0;
        goto LAB_00103cd3;
      case 0xb:
        if (pCVar30[-2].type != BOOLEAN) {
          return INTERPRET_RUNTIME_ERROR;
        }
        if (pCVar30[-1].type != BOOLEAN) {
          return INTERPRET_RUNTIME_ERROR;
        }
        bVar31 = pCVar30[-1].field_1.p_value == 0 && pCVar30[-2].field_1.p_value == 0;
        goto LAB_00103c53;
      case 0xc:
        second_01._4_4_ = 0;
        second_01.type = pCVar30[-1].type;
        first_01._4_4_ = 0;
        first_01.type = pCVar30[-2].type;
        first_01.field_1.p_value = pCVar30[-2].field_1.p_value;
        second_01.field_1.p_value = pCVar30[-1].field_1.p_value;
        iVar18 = cmp_values(first_01,second_01);
        bVar31 = iVar18 == 0;
        goto LAB_00103cd3;
      case 0xd:
        second_04._4_4_ = 0;
        second_04.type = pCVar30[-1].type;
        first_04._4_4_ = 0;
        first_04.type = pCVar30[-2].type;
        first_04.field_1.p_value = pCVar30[-2].field_1.p_value;
        second_04.field_1.p_value = pCVar30[-1].field_1.p_value;
        iVar18 = cmp_values(first_04,second_04);
        bVar31 = iVar18 == 0;
LAB_00103c53:
        bVar31 = !bVar31;
        goto LAB_00103cd3;
      case 0xe:
        second_00._4_4_ = 0;
        second_00.type = pCVar30[-1].type;
        first_00._4_4_ = 0;
        first_00.type = pCVar30[-2].type;
        first_00.field_1.p_value = pCVar30[-2].field_1.p_value;
        second_00.field_1.p_value = pCVar30[-1].field_1.p_value;
        iVar18 = cmp_values(first_00,second_00);
        bVar31 = 0 < iVar18;
        goto LAB_00103cd3;
      case 0xf:
        second_02._4_4_ = 0;
        second_02.type = pCVar30[-1].type;
        first_02._4_4_ = 0;
        first_02.type = pCVar30[-2].type;
        first_02.field_1.p_value = pCVar30[-2].field_1.p_value;
        second_02.field_1.p_value = pCVar30[-1].field_1.p_value;
        iVar18 = cmp_values(first_02,second_02);
        bVar24 = (byte)((uint)iVar18 >> 0x18);
        goto LAB_00103b0a;
      case 0x10:
        second._4_4_ = 0;
        second.type = pCVar30[-1].type;
        first._4_4_ = 0;
        first.type = pCVar30[-2].type;
        first.field_1.p_value = pCVar30[-2].field_1.p_value;
        second.field_1.p_value = pCVar30[-1].field_1.p_value;
        iVar18 = cmp_values(first,second);
        bVar24 = ~(byte)((uint)iVar18 >> 0x18);
LAB_00103b0a:
        bVar31 = (bool)(bVar24 >> 7);
        goto LAB_00103cd3;
      case 0x11:
        second_03._4_4_ = 0;
        second_03.type = pCVar30[-1].type;
        first_03._4_4_ = 0;
        first_03.type = pCVar30[-2].type;
        first_03.field_1.p_value = pCVar30[-2].field_1.p_value;
        second_03.field_1.p_value = pCVar30[-1].field_1.p_value;
        iVar18 = cmp_values(first_03,second_03);
        bVar31 = iVar18 < 1;
LAB_00103cd3:
        CVar36 = create_bool(bVar31);
LAB_00103cd8:
        in_RDX = CVar36.field_1;
        pCVar30[-2].type = CVar36.type;
        pCVar30[-2].field_1.p_value = (uint64_t)in_RDX;
        pCVar30 = pCVar30 + -1;
        break;
      case 0x12:
        uVar25 = (uint)pbVar28[1];
        pbVar29 = pbVar28 + 2;
        goto LAB_00103e05;
      case 0x13:
        pbVar29 = pbVar28 + 3;
        uVar25 = (uint)(ushort)(*(ushort *)(pbVar28 + 1) << 8 | *(ushort *)(pbVar28 + 1) >> 8);
LAB_00103e05:
        puVar2 = (undefined8 *)((long)&pCVar9->type + (ulong)(uVar25 << 4));
        uVar34 = *puVar2;
        aVar21 = *(anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(puVar2 + 1);
LAB_00103e43:
        *(undefined8 *)pCVar30 = uVar34;
        pCVar30->field_1 = aVar21;
        pCVar30 = pCVar30 + 1;
        break;
      case 0x14:
        dVar33 = 0.0;
        goto LAB_00103c2c;
      case 0x15:
        dVar33 = 1.0;
LAB_00103c2c:
        CVar36 = create_number(dVar33);
        goto LAB_00103d8a;
      case 0x16:
        pbVar29 = pbVar28 + 2;
        value_04._4_4_ = 0;
        value_04.type = pCVar30[-1].type;
        value_04.field_1.p_value = pCVar30[-1].field_1.p_value;
        write_at(&pCVar7->variables,(ulong)pbVar28[1],value_04);
        in_RDX = extraout_RDX_03;
        pCVar30 = pCVar30 + -1;
        break;
      case 0x17:
        pCVar23 = (pCVar7->variables).values;
        bVar24 = pbVar28[1];
        pbVar29 = pbVar28 + 2;
        goto LAB_00103e3b;
      case 0x18:
        bVar24 = pbVar28[2];
        pbVar29 = pbVar28 + 3;
        in_RDX.p_value = (uint64_t)*pppCVar1;
        pCVar23 = (((CallFrame **)(in_RDX.p_value - 8))[pbVar28[1]]->variables).values;
LAB_00103e3b:
        uVar34 = *(undefined8 *)(pCVar23 + bVar24);
        aVar21 = pCVar23[bVar24].field_1;
        goto LAB_00103e43;
      case 0x19:
        pbVar29 = pbVar28 + 3;
        in_RDX.p_value = (uint64_t)*pppCVar1;
        uVar16 = *(undefined4 *)&pCVar30[-1].field_0x4;
        aVar21 = pCVar30[-1].field_1;
        pCVar23 = (((CallFrame **)(in_RDX.p_value - 8))[pbVar28[1]]->variables).values + pbVar28[2];
        pCVar23->type = pCVar30[-1].type;
        *(undefined4 *)&pCVar23->field_0x4 = uVar16;
        pCVar23->field_1 = aVar21;
        pCVar30 = pCVar30 + -1;
        break;
      case 0x1a:
        uVar16 = *(undefined4 *)&pCVar30[-1].field_0x4;
        aVar21 = pCVar30[-1].field_1;
        pCVar30->type = pCVar30[-1].type;
        *(undefined4 *)&pCVar30->field_0x4 = uVar16;
        pCVar30->field_1 = aVar21;
        goto LAB_00103d95;
      case 0x1b:
        pCVar30 = pCVar30 + -1;
        break;
      case 0x1c:
        bVar24 = pbVar28[1];
        uVar14 = (ulong)bVar24;
        if (pCVar30[-1 - uVar14].type != OBJECT) {
          run_cold_23();
          return INTERPRET_RUNTIME_ERROR;
        }
        pbVar29 = pbVar28 + 2;
        pOVar11 = pCVar30[-1 - uVar14].field_1.o_value;
        pOVar11->marked = '\x01';
        if (pOVar11->type == OBJ_LAMBDA) {
          bVar4 = pOVar11[1].marked;
          if (bVar4 != bVar24) {
LAB_0010429a:
            fprintf(_stderr,"Invalid number of arguments. Expected %d, but got %d\n",(ulong)bVar4,
                    (ulong)bVar24);
            return INTERPRET_RUNTIME_ERROR;
          }
          lVar15 = (ulong)bVar24 * -0x10;
          if (bVar24 != 0) {
            lVar27 = -0x10;
            lVar26 = 0;
            do {
              puVar2 = (undefined8 *)((long)&pCVar30->type + lVar27);
              uVar34 = puVar2[1];
              puVar3 = (undefined8 *)((long)&uStack_a8 + lVar26 + lVar15 + -0xa8 + 0xa8);
              *puVar3 = *puVar2;
              puVar3[1] = uVar34;
              lVar26 = lVar26 + 0x10;
              lVar27 = lVar27 + -0x10;
            } while ((ulong)bVar24 * 0x10 != lVar26);
            pCVar30 = (CrispyValue *)((long)pCVar30 - lVar26);
          }
          pCVar22 = (CallFrame *)pOVar11[1].next;
          *(undefined8 *)(&stack0xffffffffffffff50 + lVar15) = 0x104147;
          pCVar22 = new_temp_call_frame(pCVar22);
          index = vm->frame_count;
          vm->frame_count = index + 1;
          *(undefined8 *)(&stack0xffffffffffffff50 + lVar15) = 0x10415e;
          frames_write_at(&vm->frames,index,pCVar22);
          pCVar23 = pCVar30;
          if (bVar24 != 0) {
            lVar26 = 0;
            do {
              lVar27 = lVar26;
              puVar2 = (undefined8 *)((long)&uStack_a8 + lVar27 + lVar15 + -0xa8 + 0xa8);
              uVar34 = puVar2[1];
              puVar3 = (undefined8 *)((long)&pCVar30->type + lVar27);
              *puVar3 = *puVar2;
              puVar3[1] = uVar34;
              lVar26 = lVar27 + 0x10;
            } while ((ulong)bVar24 * 0x10 != lVar27 + 0x10);
            pCVar23 = (CrispyValue *)((long)&pCVar30[1].type + lVar27);
          }
          vm->sp = pCVar23;
          *(undefined8 *)(&stack0xffffffffffffff50 + lVar15) = 0x104193;
          IVar19 = run(vm);
          ppCVar13 = (vm->frames).frame_pointers;
          uVar25 = vm->frame_count - 1;
          vm->frame_count = uVar25;
          pCVar22 = ppCVar13[uVar25];
          *(undefined8 *)(&stack0xffffffffffffff50 + lVar15) = 0x1041c0;
          temp_call_frame_free(pCVar22);
          in_RDX = extraout_RDX_06;
          if (IVar19 != INTERPRET_OK) {
            return IVar19;
          }
        }
        else {
          if (pOVar11->type != OBJ_NATIVE_FUNC) {
            run_cold_24();
            return INTERPRET_RUNTIME_ERROR;
          }
          bVar4 = pOVar11[1].field_0x1;
          if (bVar4 != bVar24) goto LAB_0010429a;
          lVar15 = (ulong)bVar24 * -0x10;
          if (bVar24 != 0) {
            lVar26 = 0;
            do {
              puVar2 = (undefined8 *)((long)&pCVar30[-uVar14].type + lVar26);
              uVar34 = puVar2[1];
              puVar3 = (undefined8 *)((long)(&uStack_a8 + (ulong)bVar24 * -2) + lVar26);
              *puVar3 = *puVar2;
              puVar3[1] = uVar34;
              lVar26 = lVar26 + 0x10;
            } while (uVar14 * 0x10 != lVar26);
            pCVar30 = (CrispyValue *)((long)pCVar30 - lVar26);
          }
          if (pOVar11[1].marked == '\0') {
            poVar12 = pOVar11[1].next;
            *(undefined8 *)(&stack0xffffffffffffff50 + lVar15) = 0x104200;
            VVar20 = (*(code *)poVar12)();
            in_RDX = extraout_RDX_07;
          }
          else {
            vm->sp = pCVar30;
            vm->current_status = VM_STATUS_NO_GC;
            poVar12 = pOVar11[1].next;
            *(undefined8 *)(&stack0xffffffffffffff50 + lVar15) = 0x103ef6;
            auVar35 = (*(code *)poVar12)(&uStack_a8 + (ulong)bVar24 * -2,vm);
            in_RDX.p_value = auVar35._8_8_;
            VVar20 = auVar35._0_4_;
            vm->current_status = VM_STATUS_RUNNING;
            if (vm->err_flag != false) {
              vm->err_flag = false;
              value_01._0_8_ = auVar35._0_8_ & 0xffffffff;
              *(undefined8 *)(&stack0xffffffffffffff50 + lVar15) = 0x10426b;
              value_01.field_1.p_value = in_RDX.p_value;
              print_value(value_01,true,false);
              return INTERPRET_RUNTIME_ERROR;
            }
          }
          pCVar30[-1].type = VVar20;
          pCVar30[-1].field_1.p_value = (uint64_t)in_RDX;
        }
        break;
      case 0x1d:
        CVar36 = create_number((double)(pCVar30[-1].field_1.p_value ^ (ulong)DAT_00109650));
        in_RDX = CVar36.field_1;
        pCVar30[-1].type = CVar36.type;
        pCVar30[-1].field_1.p_value = (uint64_t)in_RDX;
        break;
      case 0x1e:
        if (pCVar30[-1].type != BOOLEAN) {
          return INTERPRET_RUNTIME_ERROR;
        }
        aVar21.p_value._1_7_ = 0;
        aVar21.p_value._0_1_ = pCVar30[-1].field_1.p_value == 0;
        pCVar30[-1].field_1 = aVar21;
        break;
      case 0x1f:
        value_00._4_4_ = 0;
        value_00.type = pCVar30[-1].type;
        aVar21 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)pCVar30[-1].field_1.p_value;
        printf("> ");
        value_00.field_1 =
             (anon_union_8_3_4e733eb7_for_CrispyValue_1)
             (anon_union_8_3_4e733eb7_for_CrispyValue_1)aVar21.p_value;
        print_value(value_00,true,true);
        in_RDX = extraout_RDX_02;
        pCVar30 = pCVar30 + -1;
        break;
      case 0x20:
        ht_init((HashTable *)auStack_a0,HT_KEY_OBJSTRING,8,free_objstring);
        content.size = value.type;
        content._12_4_ = value._4_4_;
        content.key_type = auStack_a0._0_4_;
        content.cap = auStack_a0._4_4_;
        content.free_callback = (_func_void_HTItem_ptr *)value.field_1.p_value;
        content.buckets = ppHStack_88;
        object = new_dict(vm,content);
        goto LAB_00103d82;
      case 0x21:
        object = (ObjDict *)new_list(vm,0);
LAB_00103d82:
        CVar36 = create_object(&object->object);
        goto LAB_00103d8a;
      case 0x22:
        if ((pCVar30[-2].type != OBJECT) ||
           ((((ObjList *)pCVar30[-2].field_1.o_value)->object).type != OBJ_LIST)) {
          run_cold_17();
          return INTERPRET_RUNTIME_ERROR;
        }
        value_02._4_4_ = 0;
        value_02.type = pCVar30[-1].type;
        value_02.field_1.p_value = pCVar30[-1].field_1.p_value;
        list_append((ObjList *)pCVar30[-2].field_1.o_value,value_02);
        in_RDX = extraout_RDX_01;
        pCVar30 = pCVar30 + -1;
        break;
      case 0x23:
        if (pCVar30[-3].type != OBJECT) {
          run_cold_11();
          return INTERPRET_RUNTIME_ERROR;
        }
        VVar20 = pCVar30[-1].type;
        CVar36._4_4_ = 0;
        CVar36.type = VVar20;
        aVar21 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)pCVar30[-1].field_1.p_value;
        VVar6 = pCVar30[-2].type;
        dVar33 = pCVar30[-2].field_1.d_value;
        pOVar10 = (ObjList *)pCVar30[-3].field_1.o_value;
        OVar5 = (pOVar10->object).type;
        if (OVar5 == OBJ_LIST) {
          dVar32 = floor(dVar33);
          if (((VVar6 != NUMBER) || (dVar32 != dVar33)) || (NAN(dVar32) || NAN(dVar33))) {
            run_cold_13();
            return INTERPRET_RUNTIME_ERROR;
          }
          value_05._4_4_ = 0;
          value_05.type = VVar20;
          value_05.field_1.p_value = aVar21.p_value;
          _Var17 = list_add(pOVar10,(long)dVar33,value_05);
          in_RDX = extraout_RDX_04;
          pCVar30 = pCVar30 + -2;
          if (!_Var17) {
            run_cold_12();
            return INTERPRET_RUNTIME_ERROR;
          }
        }
        else {
          if (OVar5 != OBJ_DICT) {
            run_cold_16();
            return INTERPRET_RUNTIME_ERROR;
          }
          if (VVar6 != OBJECT) {
            run_cold_14();
            return INTERPRET_RUNTIME_ERROR;
          }
          if (*(int *)((long)dVar33 + 4) != 0) {
            run_cold_15();
            return INTERPRET_RUNTIME_ERROR;
          }
          key.field_0.ident_length = in_RDX.p_value;
          key._0_8_ = dVar33;
          CVar36.field_1.p_value = aVar21.p_value;
          ht_put((HashTable *)&pOVar10->content,key,CVar36);
          in_RDX = extraout_RDX_00;
          pCVar30 = pCVar30 + -2;
        }
        break;
      case 0x24:
        if (pCVar30[-2].type != OBJECT) {
          run_cold_5();
          return INTERPRET_RUNTIME_ERROR;
        }
        VVar20 = pCVar30[-1].type;
        dVar33 = pCVar30[-1].field_1.d_value;
        pOVar10 = (ObjList *)pCVar30[-2].field_1.o_value;
        OVar5 = (pOVar10->object).type;
        if (OVar5 != OBJ_LIST) {
          if (OVar5 != OBJ_DICT) {
            run_cold_10();
            return INTERPRET_RUNTIME_ERROR;
          }
          if (VVar20 != OBJECT) {
            run_cold_8();
            return INTERPRET_RUNTIME_ERROR;
          }
          if (*(int *)((long)dVar33 + 4) != 0) {
            run_cold_9();
            return INTERPRET_RUNTIME_ERROR;
          }
          key_00.field_0.ident_length = in_RDX.p_value;
          key_00._0_8_ = dVar33;
          CVar36 = ht_get((HashTable *)&pOVar10->content,key_00);
          goto LAB_00103cd8;
        }
        dVar32 = floor(dVar33);
        if (((VVar20 != NUMBER) || (dVar32 != dVar33)) || (NAN(dVar32) || NAN(dVar33))) {
          run_cold_7();
          return INTERPRET_RUNTIME_ERROR;
        }
        _Var17 = list_get(pOVar10,(long)dVar33,(CrispyValue *)auStack_a0);
        if (!_Var17) {
          run_cold_6();
          return INTERPRET_RUNTIME_ERROR;
        }
        *(undefined1 (*) [8])(pCVar30 + -2) = auStack_a0;
        pCVar30[-2].field_1 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)value._0_8_;
        in_RDX = extraout_RDX_05;
        pCVar30 = pCVar30 + -1;
        break;
      case 0x25:
        if (pCVar30[-2].type != OBJECT) {
          run_cold_1();
          return INTERPRET_RUNTIME_ERROR;
        }
        dVar33 = pCVar30[-1].field_1.d_value;
        pOVar10 = (ObjList *)pCVar30[-2].field_1.o_value;
        OVar5 = (pOVar10->object).type;
        if (OVar5 == OBJ_DICT) {
          key_01.field_0.ident_length = in_RDX.p_value;
          key_01._0_8_ = dVar33;
          CVar36 = ht_get((HashTable *)&pOVar10->content,key_01);
          in_RDX = CVar36.field_1;
          pCVar30->type = CVar36.type;
          (pCVar30->field_1).p_value = (uint64_t)in_RDX;
        }
        else {
          if (OVar5 != OBJ_LIST) {
            run_cold_4();
            return INTERPRET_RUNTIME_ERROR;
          }
          VVar20 = pCVar30[-1].type;
          dVar32 = floor(dVar33);
          if (((VVar20 != NUMBER) || (dVar32 != dVar33)) || (NAN(dVar32) || NAN(dVar33))) {
            run_cold_3();
            return INTERPRET_RUNTIME_ERROR;
          }
          _Var17 = list_get(pOVar10,(long)dVar33 & 0xffffffff,(CrispyValue *)auStack_a0);
          if (!_Var17) {
            run_cold_2();
            return INTERPRET_RUNTIME_ERROR;
          }
          *(undefined1 (*) [8])pCVar30 = auStack_a0;
          pCVar30->field_1 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)value._0_8_;
          in_RDX = extraout_RDX;
        }
        pCVar30 = pCVar30 + 1;
        break;
      case 0x26:
        pbVar29 = puVar8 + (ushort)(*(ushort *)(pbVar28 + 1) << 8 | *(ushort *)(pbVar28 + 1) >> 8);
        break;
      case 0x27:
        pCVar23 = pCVar30 + -2;
        if (pCVar30[-2].field_1.p_value == pCVar30[-1].field_1.p_value) goto LAB_00103749;
LAB_00103939:
        pbVar29 = pbVar28 + 3;
        pCVar30 = pCVar23;
        break;
      case 0x28:
        if (pCVar30[-1].type != BOOLEAN) {
          return INTERPRET_RUNTIME_ERROR;
        }
        pCVar23 = pCVar30 + -1;
        if (pCVar30[-1].field_1.p_value != 1) goto LAB_00103939;
        goto LAB_00103749;
      case 0x29:
        if (pCVar30[-1].type != BOOLEAN) {
          return INTERPRET_RUNTIME_ERROR;
        }
        pCVar23 = pCVar30 + -1;
        if (pCVar30[-1].field_1.p_value == 1) goto LAB_00103939;
        goto LAB_00103749;
      case 0x2a:
        pCVar23 = pCVar30 + -2;
        if (pCVar30[-2].field_1.p_value == pCVar30[-1].field_1.p_value) goto LAB_00103939;
        goto LAB_00103749;
      case 0x2b:
        pCVar23 = pCVar30 + -2;
        if (pCVar30[-1].field_1.p_value <= pCVar30[-2].field_1.p_value) goto LAB_00103939;
        goto LAB_00103749;
      case 0x2c:
        pCVar23 = pCVar30 + -2;
        if (pCVar30[-1].field_1.p_value < pCVar30[-2].field_1.p_value) goto LAB_00103939;
        goto LAB_00103749;
      case 0x2d:
        pCVar23 = pCVar30 + -2;
        if (pCVar30[-2].field_1.p_value <= pCVar30[-1].field_1.p_value) goto LAB_00103939;
        goto LAB_00103749;
      case 0x2e:
        pCVar23 = pCVar30 + -2;
        if (pCVar30[-2].field_1.p_value < pCVar30[-1].field_1.p_value) goto LAB_00103939;
LAB_00103749:
        pbVar29 = puVar8 + (ushort)(*(ushort *)(pbVar28 + 1) << 8 | *(ushort *)(pbVar28 + 1) >> 8);
        pCVar30 = pCVar23;
        break;
      case 0x2f:
        pCVar23 = (pCVar7->variables).values;
        uVar14 = (ulong)pbVar28[1];
        dVar33 = pCVar23[uVar14].field_1.d_value + 1.0;
        goto LAB_00103999;
      case 0x30:
        pCVar23 = (pCVar7->variables).values;
        uVar14 = (ulong)pbVar28[1];
        dVar33 = pCVar23[uVar14].field_1.d_value + -1.0;
LAB_00103999:
        pbVar29 = pbVar28 + 2;
        pCVar23[uVar14].field_1.d_value = dVar33;
        break;
      case 0x31:
        return INTERPRET_OK;
      }
      pbVar28 = pbVar29;
    } while (-1 < (long)pCVar30 - (long)vm);
  }
  puts("Negative stack pointer");
  return INTERPRET_RUNTIME_ERROR;
}

Assistant:

static InterpretResult run(Vm *vm) {
    CallFrame *curr_frame = CURR_FRAME(vm);

    register uint8_t *ip = curr_frame->ip;
    register CrispyValue *sp = vm->sp;
    register uint8_t *code = curr_frame->code_buffer.code;

    CrispyValue *const_values = curr_frame->constants.values;
    ValueArray *variables = &curr_frame->variables;

#define READ_BYTE() (ip += 1, ip[-1])
#define READ_SHORT() (ip += 2, (uint16_t)((ip[-2] << 8) | ip[-1]))
#define READ_CONST() (const_values[READ_BYTE()])
#define READ_CONST_W() (ip += 2, const_values[(ip[-2] << 8) | ip[-1]])
#define READ_VAR() (variables->values[READ_BYTE()])
#define POP() (*(sp -= 1))
#define PUSH(value) (*sp = (value), sp += 1)
#define PEEK() (*(sp - 1))
#define BINARY_OP(op)                                           \
    do {                                                        \
        CrispyValue second = POP();                             \
        CrispyValue first = POP();                              \
        if (!CHECK_NUM(first) || !CHECK_NUM(second))            \
            goto ERROR;                                         \
        first.d_value = first.d_value op second.d_value;        \
        PUSH(first);                                            \
    } while (false)

#define COND_JUMP(op)                                           \
    do {                                                        \
        CrispyValue second = POP();                             \
        CrispyValue first = POP();                              \
        if (first.p_value op second.p_value) {                  \
            ip = code + READ_SHORT();                           \
        } else {                                                \
            READ_SHORT();                                       \
        }                                                       \
    } while(false)

    while (true) {
        OP_CODE instruction;

#if DEBUG_TRACE_EXECUTION
        {
            printf("-----\n");
            long stack_size = sp - vm->stack;
            for (int i = 0; i < stack_size; ++i) {
                printf("[%d] ", i);
                print_value(vm->stack[i], false, true);
                print_type(vm->stack[i]);
            }
            printf("sp: %li\n", stack_size);
            printf("ip: %li\n", ip - code);
            disassemble_instruction(vm, (int) (ip - code));
            printf("-----\n");
        }
#endif

#if DEBUG_TYPE_CHECK
        {
            long stack_size = sp - vm->stack;
            if (stack_size < 0) {
                printf("Negative stack pointer\n");
                goto ERROR;
            }
        }
#endif

        switch (instruction = (OP_CODE) READ_BYTE()) {
            case OP_RETURN:
                return INTERPRET_OK;
            case OP_LDC:
                PUSH(READ_CONST());
                break;
            case OP_LDC_W: {
                PUSH(READ_CONST_W());
                break;
            }
            case OP_LDC_0: {
                CrispyValue zero = create_number(0.0);
                PUSH(zero);
                break;
            }
            case OP_LDC_1: {
                CrispyValue one = create_number(1.0);
                PUSH(one);
                break;
            }
            case OP_CALL: {
                uint8_t num_args = READ_BYTE();
                CrispyValue *pos = (sp - num_args - 1);

                if (pos->type != OBJECT) {
                    fprintf(stderr, "Trying to call primitive CrispyValue\n");
                    goto ERROR;
                }

                Object *object = pos->o_value;
                object->marked = true;

                if (object->type == OBJ_NATIVE_FUNC) {
                    ObjNativeFunc *n_fn = (ObjNativeFunc *) object;
                    uint8_t expected = n_fn->num_params;

                    if (expected != num_args) {
                        fprintf(stderr, "Invalid number of arguments. Expected %d, but got %d\n", expected, num_args);
                        goto ERROR;
                    }

                    // Pop arguments from stack
                    CrispyValue args[num_args];
                    CrispyValue *start = sp - num_args;

                    for (int i = 0; i < num_args; ++i) {
                        args[i] = *(start++);
                        --sp;
                    }

                    CrispyValue res;
                    if (n_fn->system_func) {
                        vm->sp = sp;

                        // Disable garbage collection while executing native functions
                        vm->current_status = VM_STATUS_NO_GC;
                        res = ((CrispyValue (*)(CrispyValue *, Vm *vm)) n_fn->func_ptr)(args, vm);
                        vm->current_status = VM_STATUS_RUNNING;

                        if (vm->err_flag) {
                            vm->err_flag = false;
                            // the system native functions return the error message as a crispy string
                            print_value(res, true, false);
                            goto ERROR;
                        }

                    } else {
                        res = ((CrispyValue (*)(CrispyValue *)) n_fn->func_ptr)(args);
                    }

                    // pop
                    --sp;

                    PUSH(res);
                    break;
                }

                if (object->type != OBJ_LAMBDA) {
                    fprintf(stderr, "Trying to call non callable Object\n");
                    goto ERROR;
                }
                ObjLambda *lambda = ((ObjLambda *) object);

                uint8_t expected = lambda->num_params;
                if (expected != num_args) {
                    fprintf(stderr, "Invalid number of arguments. Expected %d, but got %d\n", expected, num_args);
                    goto ERROR;
                }

                // Pop arguments from stack
                CrispyValue args[num_args];
                for (int i = 0; i < num_args; ++i) {
                    args[i] = POP();
                }

                // Create a temp callframe with its own var array
                // otherwise recursion would override the variables of its predecessors on the callstack
                CallFrame *call_frame = new_temp_call_frame(lambda->call_frame);

                PUSH_FRAME(vm, call_frame);
                CrispyValue *before_sp = sp;

                for (int i = 0; i < num_args; ++i) {
                    PUSH(args[i]);
                }

                vm->sp = sp;
                InterpretResult result = run(vm);

                // free temp callframe
                temp_call_frame_free(POP_FRAME(vm));

                if (result != INTERPRET_OK) {
                    return result;
                }

                sp = before_sp;
                break;
            }
            case OP_ADD: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type == NUMBER && second.type == NUMBER) {
                    first.d_value += second.d_value;
                    PUSH(first);
                    break;
                }

                if (first.type == OBJECT) {
                    Object *first_obj = first.o_value;
                    first_obj->marked = true;

                    switch (first_obj->type) {
                        case OBJ_STRING: {
                            if (second.type != OBJECT || second.o_value->type != OBJ_STRING) {
                                fprintf(stderr,
                                        "Only strings can be appended to strings. Consider using the 'str' function\n");
                                goto ERROR;
                            }
                            ObjString *first_str = (ObjString *) first_obj;
                            ObjString *second_str = (ObjString *) second.o_value;
                            second_str->object.marked = true;

                            ObjString *dest = new_empty_string(vm, (first_str->length + second_str->length));

                            memcpy((char *) dest->start, first_str->start, first_str->length);
                            memcpy((char *) (dest->start + first_str->length), second_str->start, second_str->length);

                            PUSH(create_object((Object *) dest));
                            break;
                        }
                        case OBJ_LIST: {
                            ObjList *clone = clone_list(vm, (ObjList *) first_obj);
                            list_append(clone, second);

                            PUSH(create_object((Object *) clone));
                            break;
                        }
                        default:
                            fprintf(stderr, "Invalid target for addition\n");
                            goto ERROR;
                    }
                } else {
                    fprintf(stderr, "Invalid target for addition\n");
                    goto ERROR;
                }

                break;
            }
            case OP_SUB:
                BINARY_OP(-);
                break;
            case OP_MUL:
                BINARY_OP(*);
                break;
            case OP_MOD: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != NUMBER || second.type != NUMBER) {
                    fprintf(stderr, "Modulo operator (%%) only works on numbers\n");
                    goto ERROR;
                }

                int64_t first_int = (int64_t) first.d_value;
                int64_t second_int = (int64_t) second.d_value;

                PUSH(create_number(first_int % second_int));
                break;
            }
            case OP_DIV: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                if (!CHECK_NUM(first) || !CHECK_NUM(second)) {
                    goto ERROR;
                }

                if (second.d_value == 0) {
                    panic(vm, "Cannot divide by zero\n");
                }

                first.d_value = first.d_value / second.d_value;
                PUSH(first);
                break;
            }
            case OP_POW: {
                CrispyValue exponent = POP();
                CrispyValue base = POP();

                if (!CHECK_NUM(base) || !CHECK_NUM(exponent)) {
                    goto ERROR;
                }

                PUSH(create_number(pow(base.d_value, exponent.d_value)));

                break;
            }
            case OP_OR: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != BOOLEAN || second.type != BOOLEAN) {
                    goto ERROR;
                }

                PUSH(create_bool(first.p_value || second.p_value));

                break;
            }
            case OP_AND: {
                CrispyValue second = POP();
                CrispyValue first = POP();

                if (first.type != BOOLEAN || second.type != BOOLEAN) {
                    goto ERROR;
                }

                PUSH(create_bool(first.p_value && second.p_value));

                break;
            }
            case OP_EQUAL: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) == 0));
                break;
            }
            case OP_NOT_EQUAL: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) != 0));
                break;
            }
            case OP_GE: {
                // TODO exception for non orderable type (e.g nil)
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) >= 0));
                break;
            }
            case OP_LE: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) <= 0));
                break;
            }
            case OP_GT: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) > 0));
                break;
            }
            case OP_LT: {
                CrispyValue second = POP();
                CrispyValue first = POP();
                PUSH(create_bool(cmp_values(first, second) < 0));
                break;
            }
            case OP_NEGATE: {
                CrispyValue val = create_number(POP().d_value * -1);
                PUSH(val);
                break;
            }
            case OP_LOAD: {
                CrispyValue val = READ_VAR();
                PUSH(val);
                break;
            }
            case OP_LOAD_OFFSET: {
                uint8_t scope = READ_BYTE();
                uint8_t index = READ_BYTE();

                CallFrame *frame = FRAME_AT(vm, scope);
                CrispyValue val = frame->variables.values[index];

                PUSH(val);

                break;
            }
            case OP_STORE_OFFSET: {
                uint8_t scope = READ_BYTE();
                uint8_t index = READ_BYTE();

                CallFrame *frame = FRAME_AT(vm, scope);
                CrispyValue val = POP();

                frame->variables.values[index] = val;
                break;
            }
            case OP_STORE: {
                uint8_t index = READ_BYTE();
                CrispyValue val = POP();
                write_at(variables, index, val);
                break;
            }
            case OP_POP:
                --sp;
                break;
            case OP_DUP: {
                CrispyValue val = PEEK();
                PUSH(val);
                break;
            }
            case OP_JMP:
                ip = code + READ_SHORT();
                break;
            case OP_JMT: {
                CrispyValue value = POP();
                if (!CHECK_BOOL(value)) { goto ERROR; }
                if (BOOL_TRUE(value)) {
                    ip = code + READ_SHORT();
                } else {
                    ip += 2;
                }
                break;
            }
            case OP_JMF: {
                CrispyValue value = POP();
                if (!CHECK_BOOL(value)) { goto ERROR; }
                if (!BOOL_TRUE(value)) {
                    ip = code + READ_SHORT();
                } else {
                    ip += 2;
                }
                break;
            }
            case OP_JEQ:
                COND_JUMP(==);
                break;
            case OP_JNE:
                COND_JUMP(!=);
                break;
            case OP_JLT:
                COND_JUMP(<);
                break;
            case OP_JLE:
                COND_JUMP(<=);
                break;
            case OP_JGT:
                COND_JUMP(>);
                break;
            case OP_JGE:
                COND_JUMP(>=);
                break;
            case OP_INC_1: {
                uint8_t index = READ_BYTE();
                ++variables->values[index].d_value;
                break;
            }
            case OP_DEC_1: {
                uint8_t index = READ_BYTE();
                --variables->values[index].d_value;
                break;
            }
            case OP_NOT: {
                CrispyValue value = POP();

                if (value.type != BOOLEAN) {
                    goto ERROR;
                }

                value.p_value = value.p_value == 0 ? 1 : 0;
                PUSH(value);
                break;
            }
            case OP_TRUE:
                PUSH(create_bool(true));
                break;
            case OP_FALSE:
                PUSH(create_bool(false));
                break;
            case OP_NOP:
                PUSH(create_bool(false));
                break;
            case OP_NIL:
                PUSH(create_nil());
                break;
            case OP_PRINT: {
                CrispyValue value = POP();
                printf("> ");
                print_value(value, true, true);
                break;
            }
            case OP_DICT_NEW: {
                HashTable content;
                ht_init(&content, HT_KEY_OBJSTRING, 8, free_objstring);

                ObjDict *dict = new_dict(vm, content);
                CrispyValue value = create_object((Object *) dict);
                PUSH(value);
                break;
            }
            case OP_LIST_NEW: {
                ObjList *list = new_list(vm, 0);
                CrispyValue list_val = create_object((Object *) list);

                PUSH(list_val);
                break;
            }
            case OP_LIST_APPEND: {
                CrispyValue value = POP();
                CrispyValue list_val = PEEK();

                if (list_val.type != OBJECT || list_val.o_value->type != OBJ_LIST) {
                    fprintf(stderr, "Can only put values into lists\n");
                    goto ERROR;
                }

                ObjList *list = (ObjList *) list_val.o_value;

                list_append(list, value);
                break;
            }
            case OP_STRUCT_SET: {
                CrispyValue value = POP();
                CrispyValue key = POP();
                CrispyValue structure = PEEK();

                if (structure.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = structure.o_value;

                switch (obj->type) {
                    case OBJ_DICT: {
                        ObjDict *dict = (ObjDict *) obj;

                        if (key.type != OBJECT) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        HTItemKey ht_key;
                        Object *key_obj = key.o_value;

                        if (key_obj->type != OBJ_STRING) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        ht_key.key_obj_string = (ObjString *) key_obj;
                        ht_put(&dict->content, ht_key, value);
                        break;
                    }
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) obj;

                        // Check if key is an integer
                        if (key.type != NUMBER || floor(key.d_value) != key.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        int64_t index = (int64_t) key.d_value;
                        bool success = list_add(list, index, value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for set operation\n");
                        goto ERROR;
                }

                break;
            }
            case OP_STRUCT_GET: {
                CrispyValue key_val = POP();
                CrispyValue struct_val = POP();

                if (struct_val.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = struct_val.o_value;

                switch (obj->type) {
                    case OBJ_DICT: {
                        if (key_val.type != OBJECT) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }


                        ObjDict *dict = (ObjDict *) obj;
                        Object *key_obj = key_val.o_value;

                        if (key_obj->type != OBJ_STRING) {
                            fprintf(stderr, "Only strings can be used as indices for dictionaries\n");
                            goto ERROR;
                        }

                        ObjString *key_string = (ObjString *) key_obj;

                        HTItemKey key;
                        key.key_obj_string = key_string;

                        CrispyValue result = ht_get(&dict->content, key);
                        PUSH(result);
                        break;
                    }
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) obj;

                        // Check if key is an integer
                        if (key_val.type != NUMBER || floor(key_val.d_value) != key_val.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        int64_t index = (int64_t) key_val.d_value;
                        CrispyValue value;
                        bool success = list_get(list, index, &value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        PUSH(value);
                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for get operation\n");
                        goto ERROR;
                }

                break;
            }
            case OP_STRUCT_PEEK: {
                CrispyValue key_val = PEEK();
                CrispyValue struct_val = sp[-2];

                if (struct_val.type != OBJECT) {
                    fprintf(stderr, "Trying to retrieve an element from a primitive value\n");
                    goto ERROR;
                }

                Object *obj = struct_val.o_value;

                switch (obj->type) {
                    case OBJ_LIST: {
                        ObjList *list = (ObjList *) struct_val.o_value;

                        // Check if key is an integer
                        if (key_val.type != NUMBER || floor(key_val.d_value) != key_val.d_value) {
                            fprintf(stderr, "Only integers can be used as indices for lists\n");
                            goto ERROR;
                        }

                        uint32_t index = (uint32_t) key_val.d_value;
                        CrispyValue value;
                        bool success = list_get(list, index, &value);

                        if (!success) {
                            fprintf(stderr, "Index out of bounds\n");
                            goto ERROR;
                        }

                        PUSH(value);
                        break;
                    }
                    case OBJ_DICT: {
                        ObjDict *dict = (ObjDict *) struct_val.o_value;
                        ObjString *key_string = (ObjString *) key_val.o_value;

                        HTItemKey key;
                        key.key_obj_string = key_string;

                        CrispyValue result = ht_get(&dict->content, key);
                        PUSH(result);
                        break;
                    }
                    default:
                        fprintf(stderr, "Invalid receiver for get operation\n");
                        goto ERROR;
                }

                break;
            }
            default:
                printf("Unknown instruction %d\n", instruction);
                return INTERPRET_RUNTIME_ERROR;
        }
    }

    ERROR:
    return INTERPRET_RUNTIME_ERROR;

#undef COND_JUMP
#undef BINARY_OP
#undef PEEK
#undef PUSH
#undef POP
#undef READ_VAR
#undef READ_CONST
#undef READ_CONST_W
#undef READ_SHORT
#undef READ_BYTE
}